

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix * __thiscall maths::Matrix::operator-=(Matrix *this,Matrix *m)

{
  int j;
  int i;
  Matrix *m_local;
  Matrix *this_local;
  
  for (i = 0; i < this->rows_; i = i + 1) {
    for (j = 0; j < this->cols_; j = j + 1) {
      this->p[i][j] = this->p[i][j] - m->p[i][j];
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator-=(const Matrix& m)
{
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] -= m.p[i][j];
        }
    }
    return *this;
}